

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_comb_recode_scalar
              (mbedtls_ecp_group *grp,mbedtls_mpi *m,uchar *k,size_t d,uchar w,uchar *parity_trick)

{
  int iVar1;
  undefined1 local_68 [8];
  mbedtls_mpi mm;
  mbedtls_mpi M;
  int ret;
  uchar *parity_trick_local;
  uchar w_local;
  size_t d_local;
  uchar *k_local;
  mbedtls_mpi *m_local;
  mbedtls_ecp_group *grp_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&mm.s);
  mbedtls_mpi_init((mbedtls_mpi *)local_68);
  iVar1 = mbedtls_mpi_get_bit(&grp->N,0);
  if (iVar1 == 1) {
    iVar1 = mbedtls_mpi_get_bit(m,0);
    *parity_trick = iVar1 == 0;
    M._12_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&mm.s,m);
    if (((M._12_4_ == 0) &&
        (M._12_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_68,&grp->N,m), M._12_4_ == 0)) &&
       (M._12_4_ = mbedtls_mpi_safe_cond_assign
                             ((mbedtls_mpi *)&mm.s,(mbedtls_mpi *)local_68,*parity_trick),
       M._12_4_ == 0)) {
      ecp_comb_recode_core(k,d,w,(mbedtls_mpi *)&mm.s);
    }
    mbedtls_mpi_free((mbedtls_mpi *)local_68);
    mbedtls_mpi_free((mbedtls_mpi *)&mm.s);
    grp_local._4_4_ = M._12_4_;
  }
  else {
    grp_local._4_4_ = -0x4f80;
  }
  return grp_local._4_4_;
}

Assistant:

static int ecp_comb_recode_scalar(const mbedtls_ecp_group *grp,
                                  const mbedtls_mpi *m,
                                  unsigned char k[COMB_MAX_D + 1],
                                  size_t d,
                                  unsigned char w,
                                  unsigned char *parity_trick)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi M, mm;

    mbedtls_mpi_init(&M);
    mbedtls_mpi_init(&mm);

    /* N is always odd (see above), just make extra sure */
    if (mbedtls_mpi_get_bit(&grp->N, 0) != 1) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    /* do we need the parity trick? */
    *parity_trick = (mbedtls_mpi_get_bit(m, 0) == 0);

    /* execute parity fix in constant time */
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&M, m));
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&mm, &grp->N, m));
    MBEDTLS_MPI_CHK(mbedtls_mpi_safe_cond_assign(&M, &mm, *parity_trick));

    /* actual scalar recoding */
    ecp_comb_recode_core(k, d, w, &M);

cleanup:
    mbedtls_mpi_free(&mm);
    mbedtls_mpi_free(&M);

    return ret;
}